

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GetErrorCase::iterate(GetErrorCase *this)

{
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  undefined1 local_60 [8];
  DebugMessageTestContext context;
  TestLog *log;
  GetErrorCase *this_local;
  
  context.m_debugHost =
       (BaseCase *)
       tcu::TestContext::getLog
                 ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.
                  super_TestNode.m_testCtx);
  renderCtx = gles31::Context::getRenderContext
                        ((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context);
  ctxInfo = gles31::Context::getContextInfo
                      ((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context);
  DebugMessageTestContext::DebugMessageTestContext
            ((DebugMessageTestContext *)local_60,&this->super_BaseCase,renderCtx,ctxInfo,
             (TestLog *)context.m_debugHost,&(this->super_BaseCase).m_results,true);
  TestFunctionWrapper::call(&this->m_errorFunc,(DebugMessageTestContext *)local_60);
  tcu::ResultCollector::setTestContextResult
            (&(this->super_BaseCase).m_results,
             (this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
             m_testCtx);
  DebugMessageTestContext::~DebugMessageTestContext((DebugMessageTestContext *)local_60);
  return STOP;
}

Assistant:

GetErrorCase::IterateResult GetErrorCase::iterate (void)
{
	tcu::TestLog&			log		= m_testCtx.getLog();
	DebugMessageTestContext	context	= DebugMessageTestContext(*this, m_context.getRenderContext(), m_context.getContextInfo(), log, m_results, true);

	m_errorFunc.call(context);

	m_results.setTestContextResult(m_testCtx);

	return STOP;
}